

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O3

int SSL_ECH_KEYS_has_duplicate_config_id(SSL_ECH_KEYS *keys)

{
  byte bVar1;
  size_t sVar2;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar3;
  long lVar4;
  uint uVar5;
  bool seen [256];
  byte abStack_118 [264];
  
  uVar5 = 0;
  memset(abStack_118,0,0x100);
  sVar2 = (keys->configs).size_;
  if (sVar2 != 0) {
    puVar3 = (keys->configs).data_;
    lVar4 = 0;
    do {
      bVar1 = *(byte *)(*(long *)((long)&(puVar3->_M_t).
                                         super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>.
                                         _M_head_impl + lVar4) + 0x43);
      uVar5 = (uint)abStack_118[bVar1];
      if (abStack_118[bVar1] != 0) {
        return uVar5;
      }
      abStack_118[bVar1] = 1;
      lVar4 = lVar4 + 8;
    } while (sVar2 << 3 != lVar4);
  }
  return uVar5;
}

Assistant:

int SSL_ECH_KEYS_has_duplicate_config_id(const SSL_ECH_KEYS *keys) {
  bool seen[256] = {false};
  for (const auto &config : keys->configs) {
    if (seen[config->ech_config().config_id]) {
      return 1;
    }
    seen[config->ech_config().config_id] = true;
  }
  return 0;
}